

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

TrieNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  byte bVar1;
  pointer pppuVar2;
  uint uVar3;
  TrieNode<unsigned_char> *__s;
  ulong uVar4;
  uchar *puVar5;
  vector_bagwell<unsigned_char_*,_16U> *pvVar6;
  uint j_1;
  uint j;
  long lVar7;
  uchar **t;
  size_t index;
  ulong uVar8;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  uchar *local_230 [64];
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  uVar8 = 0;
  memset(__s,0,0x820);
  if (bucket->_insertpos != (uchar **)0x0) {
    pppuVar2 = (bucket->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar4 = (ulong)((long)bucket->_insertpos +
                   ((long)((1 << ((char)((uint)((int)pppuVar2 -
                                               *(int *)&(bucket->_index_block).
                                                                                                                
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                  3U & 0x1f)) + -0x10) * 8 - (long)pppuVar2[-1])) >> 3;
    uVar3 = (uint)uVar4;
    if (0x3f < uVar3) {
      uVar8 = 0;
      do {
        lVar7 = 0;
        do {
          puVar5 = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,lVar7 + uVar8);
          local_230[lVar7] = puVar5;
          if (puVar5 == (uchar *)0x0) goto LAB_001a8408;
          abStack_270[lVar7] = puVar5[depth];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x40);
        t = local_230;
        lVar7 = 0;
        do {
          bVar1 = abStack_270[lVar7];
          pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)(__s->buckets)._M_elems[bVar1];
          if (pvVar6 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
            pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
            (pvVar6->_index_block).
            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar6->_index_block).
            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar6->_index_block).
            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar6->_insertpos = (uchar **)0x0;
            pvVar6->_left_in_block = 0;
            (__s->buckets)._M_elems[bVar1] = pvVar6;
          }
          vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar6,t);
          lVar7 = lVar7 + 1;
          t = t + 1;
        } while (lVar7 != 0x40);
        uVar8 = uVar8 + 0x40;
      } while (uVar8 < (uVar3 & 0xffffffc0));
    }
    if ((uint)uVar8 < uVar3) {
      index = uVar8 & 0xffffffff;
      do {
        local_230[0] = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,index);
        if (local_230[0] == (uchar *)0x0) {
LAB_001a8408:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        bVar1 = local_230[0][depth];
        pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)(__s->buckets)._M_elems[bVar1];
        if (pvVar6 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
          pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
          (pvVar6->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar6->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar6->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar6->_insertpos = (uchar **)0x0;
          pvVar6->_left_in_block = 0;
          (__s->buckets)._M_elems[bVar1] = pvVar6;
        }
        vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar6,local_230);
        index = index + 1;
      } while ((uVar4 & 0xffffffff) != index);
    }
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}